

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Rebalancing::Node>::Stack
          (Stack<Kernel::Rebalancing::Node> *this,Stack<Kernel::Rebalancing::Node> *s)

{
  size_t sVar1;
  BottomFirstIterator it;
  Node *pNVar2;
  ulong uVar3;
  
  sVar1 = s->_capacity;
  this->_capacity = sVar1;
  if (sVar1 == 0) {
    pNVar2 = (Node *)0x0;
  }
  else {
    uVar3 = sVar1 << 4;
    if (uVar3 == 0) {
      pNVar2 = (Node *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x11) {
      pNVar2 = (Node *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar3 < 0x19) {
      pNVar2 = (Node *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar3 < 0x21) {
      pNVar2 = (Node *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar3 < 0x31) {
      pNVar2 = (Node *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar3 < 0x41) {
      pNVar2 = (Node *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      pNVar2 = (Node *)::operator_new(uVar3,0x10);
    }
  }
  this->_stack = pNVar2;
  this->_cursor = pNVar2;
  this->_end = pNVar2 + this->_capacity;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  loadFromIterator<Lib::Stack<Kernel::Rebalancing::Node>::BottomFirstIterator>(this,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }